

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avs2d_dpb.c
# Opt level: O1

MPP_RET dpb_remove_unused_frame(Avs2dCtx_t *p_dec)

{
  Avs2dFrame_t *p;
  uint uVar1;
  RK_S32 RVar2;
  uint uVar3;
  ulong uVar4;
  
  if (((byte)avs2d_parse_debug & 8) != 0) {
    _mpp_log_l(4,"avs2d_dpb","In.","dpb_remove_unused_frame");
  }
  if ((p_dec->frm_mgr).dpb_size != 0) {
    uVar4 = 0;
    do {
      p = (p_dec->frm_mgr).dpb[uVar4];
      if (p->slot_idx != -1) {
        uVar1 = p->poi - (p_dec->ph).poi;
        uVar3 = -uVar1;
        if (0 < (int)uVar1) {
          uVar3 = uVar1;
        }
        if (0x7f < uVar3) {
          p->refered_by_others = '\0';
          p->refered_by_scene = '\0';
        }
        if ((p->is_output != '\0') || (p->invisible != '\0')) {
          RVar2 = is_refered(p);
          if (RVar2 == 0) {
            dpb_remove_frame(p_dec,p);
          }
        }
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < (p_dec->frm_mgr).dpb_size);
  }
  if (((byte)avs2d_parse_debug & 8) != 0) {
    _mpp_log_l(4,"avs2d_dpb","Out.","dpb_remove_unused_frame");
  }
  return MPP_OK;
}

Assistant:

MPP_RET dpb_remove_unused_frame(Avs2dCtx_t *p_dec)
{
    RK_U32 i = 0;
    MPP_RET ret = MPP_OK;
    Avs2dFrame_t *p = NULL;
    Avs2dFrameMgr_t *mgr = &p_dec->frm_mgr;

    AVS2D_PARSE_TRACE("In.");
    for (i = 0; i < mgr->dpb_size; i++) {
        p = mgr->dpb[i];
        if (p->slot_idx == NO_VAL) {
            continue;
        }

        if ((MPP_ABS(p->poi - p_dec->ph.poi) >= AVS2_MAX_POC_DISTANCE)) {
            p->refered_by_others = 0;
            p->refered_by_scene = 0;
        }

        if ((p->is_output || p->invisible) && !is_refered(p)) {
            FUN_CHECK(ret = dpb_remove_frame(p_dec, p));
        }
    }

__FAILED:
    AVS2D_PARSE_TRACE("Out.");
    return ret;
}